

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

Node * __thiscall
TMap<int,_FUDMFKeys,_THashTraits<int>,_TValueTraits<FUDMFKeys>_>::NewKey
          (TMap<int,_FUDMFKeys,_THashTraits<int>,_TValueTraits<FUDMFKeys>_> *this,int key)

{
  Node *pNVar1;
  undefined7 uVar2;
  uint uVar3;
  int iVar4;
  undefined4 uVar5;
  Node *pNVar6;
  uint uVar7;
  Node *pNVar8;
  Node *pNVar9;
  
  while (uVar7 = this->Size - 1 & key, pNVar1 = this->Nodes + uVar7,
        this->Nodes[uVar7].Next != (Node *)0x1) {
    pNVar6 = GetFreePos(this);
    if (pNVar6 != (Node *)0x0) {
      pNVar9 = this->Nodes + (this->Size - 1 & (pNVar1->Pair).Key);
      if (this->Nodes + (this->Size - 1 & (pNVar1->Pair).Key) != pNVar1) goto LAB_0045ffd1;
      pNVar6->Next = pNVar1->Next;
      pNVar9 = pNVar6;
      goto LAB_0045fffc;
    }
    Rehash(this);
  }
LAB_0045fff7:
  pNVar6 = (Node *)0x0;
  pNVar9 = pNVar1;
LAB_0045fffc:
  pNVar1->Next = pNVar6;
  this->NumUsed = this->NumUsed + 1;
  (pNVar9->Pair).Key = key;
  return pNVar9;
LAB_0045ffd1:
  do {
    pNVar8 = pNVar9;
    pNVar9 = pNVar8->Next;
  } while (pNVar9 != pNVar1);
  pNVar8->Next = pNVar6;
  uVar2 = *(undefined7 *)&(pNVar1->Pair).Value.field_0x11;
  (pNVar6->Pair).Value.mSorted = (pNVar1->Pair).Value.mSorted;
  *(undefined7 *)&(pNVar6->Pair).Value.field_0x11 = uVar2;
  pNVar9 = pNVar1->Next;
  iVar4 = (pNVar1->Pair).Key;
  uVar5 = *(undefined4 *)&(pNVar1->Pair).field_0x4;
  uVar7 = (pNVar1->Pair).Value.super_TArray<FUDMFKey,_FUDMFKey>.Most;
  uVar3 = (pNVar1->Pair).Value.super_TArray<FUDMFKey,_FUDMFKey>.Count;
  (pNVar6->Pair).Value.super_TArray<FUDMFKey,_FUDMFKey>.Array =
       (pNVar1->Pair).Value.super_TArray<FUDMFKey,_FUDMFKey>.Array;
  (pNVar6->Pair).Value.super_TArray<FUDMFKey,_FUDMFKey>.Most = uVar7;
  (pNVar6->Pair).Value.super_TArray<FUDMFKey,_FUDMFKey>.Count = uVar3;
  pNVar6->Next = pNVar9;
  (pNVar6->Pair).Key = iVar4;
  *(undefined4 *)&(pNVar6->Pair).field_0x4 = uVar5;
  goto LAB_0045fff7;
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}